

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O1

UCollationResult
ucol_strcollIter_63(UCollator *coll,UCharIterator *sIter,UCharIterator *tIter,UErrorCode *status)

{
  UCollationResult UVar1;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((coll != (UCollator *)0x0) &&
       ((sIter != (UCharIterator *)0x0 && (tIter != (UCharIterator *)0x0)))) {
      UVar1 = (**(code **)(*(long *)coll + 0x60))();
      return UVar1;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return UCOL_EQUAL;
}

Assistant:

U_CAPI UCollationResult U_EXPORT2
ucol_strcollIter( const UCollator    *coll,
                 UCharIterator *sIter,
                 UCharIterator *tIter,
                 UErrorCode         *status)
{
    if(!status || U_FAILURE(*status)) {
        return UCOL_EQUAL;
    }

    UTRACE_ENTRY(UTRACE_UCOL_STRCOLLITER);
    UTRACE_DATA3(UTRACE_VERBOSE, "coll=%p, sIter=%p, tIter=%p", coll, sIter, tIter);

    if(sIter == NULL || tIter == NULL || coll == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        UTRACE_EXIT_VALUE_STATUS(UCOL_EQUAL, *status);
        return UCOL_EQUAL;
    }

    UCollationResult result = Collator::fromUCollator(coll)->compare(*sIter, *tIter, *status);

    UTRACE_EXIT_VALUE_STATUS(result, *status);
    return result;
}